

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

uint32_t __thiscall
slang::IntervalMapDetails::
NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
::findFirstOverlap(NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
                   *this,uint32_t i,uint32_t size,interval<unsigned_long> *key)

{
  ulong uVar1;
  ulong uVar2;
  LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true> *self;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
  *pNVar3;
  char cVar4;
  
  if (i < size) {
    uVar2 = (ulong)i;
    uVar1 = uVar2 * 0x10;
    pNVar3 = this + uVar1 + 8;
    do {
      cVar4 = '\x06';
      if (*(ulong *)(pNVar3 + -8) <= key->right) {
        cVar4 = key->left <= *(ulong *)pNVar3;
        uVar1 = uVar1 & 0xffffffff;
        if ((bool)cVar4) {
          uVar1 = uVar2 & 0xffffffff;
        }
      }
      if (cVar4 != '\0') {
        if (cVar4 == '\x06') {
          return size;
        }
        return (uint32_t)uVar1;
      }
      uVar2 = uVar2 + 1;
      pNVar3 = pNVar3 + 0x10;
    } while (size != uVar2);
  }
  return size;
}

Assistant:

uint32_t findFirstOverlap(uint32_t i, uint32_t size, const interval<TKey>& key) const {
        SLANG_ASSERT(i <= size);
        SLANG_ASSERT(size <= TDerived::Capacity);
        auto& self = *static_cast<const TDerived*>(this);

        for (; i < size; i++) {
            // Our left values are ordered, so if our right is before the
            // current left then there's no way anything here overlaps.
            auto curr = self.keyAt(i);
            if (curr.left > key.right)
                break;

            if (curr.right >= key.left)
                return i;
        }

        return size;
    }